

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

void __thiscall kj::Arena::Arena(Arena *this,ArrayPtr<unsigned_char> scratch)

{
  WiderType<Decay<unsigned_long>,_Decay<unsigned_long>_> WVar1;
  size_t sVar2;
  ChunkHeader *pCVar3;
  uchar *puVar4;
  ChunkHeader *chunk;
  unsigned_long local_28;
  Arena *local_20;
  Arena *this_local;
  ArrayPtr<unsigned_char> scratch_local;
  
  scratch_local.ptr = (uchar *)scratch.size_;
  this_local = (Arena *)scratch.ptr;
  local_28 = 0x18;
  local_20 = this;
  chunk = (ChunkHeader *)ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)&this_local);
  WVar1 = max<unsigned_long,unsigned_long>(&local_28,(unsigned_long *)&chunk);
  this->nextChunkSize = WVar1;
  this->chunkList = (ChunkHeader *)0x0;
  this->objectList = (ObjectHeader *)0x0;
  this->currentChunk = (ChunkHeader *)0x0;
  sVar2 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)&this_local);
  if (0x18 < sVar2) {
    pCVar3 = (ChunkHeader *)ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&this_local);
    puVar4 = ArrayPtr<unsigned_char>::end((ArrayPtr<unsigned_char> *)&this_local);
    pCVar3->end = puVar4;
    pCVar3->pos = (byte *)(pCVar3 + 1);
    pCVar3->next = (ChunkHeader *)0x0;
    this->currentChunk = pCVar3;
  }
  return;
}

Assistant:

Arena::Arena(ArrayPtr<byte> scratch)
    : nextChunkSize(kj::max(sizeof(ChunkHeader), scratch.size())) {
  if (scratch.size() > sizeof(ChunkHeader)) {
    ChunkHeader* chunk = reinterpret_cast<ChunkHeader*>(scratch.begin());
    chunk->end = scratch.end();
    chunk->pos = reinterpret_cast<byte*>(chunk + 1);
    chunk->next = nullptr;  // Never actually observed.

    // Don't place the chunk in the chunk list because it's not ours to delete.  Just make it the
    // current chunk so that we'll allocate from it until it is empty.
    currentChunk = chunk;
  }
}